

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var __thiscall Js::JavascriptString::ToInteger(JavascriptString *this,int radix)

{
  LPCOLESTR pStrEnd;
  code *pcVar1;
  undefined8 uVar2;
  byte bVar3;
  bool bVar4;
  int32 iVar5;
  undefined4 *puVar6;
  char16 *pStr;
  CharClassifier *this_00;
  OLECHAR *pOVar7;
  uint64 uVar8;
  uint64 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  LPCOLESTR pOVar13;
  bool bVar14;
  double dVar15;
  undefined1 local_f0 [8];
  BigUInt bi;
  byte local_34;
  
  if (0x22 < radix - 2U && radix != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb95,"(radix == 0 || radix >= 2 && radix <= 36)",
                                "\'radix\' is invalid");
    if (!bVar4) goto LAB_00d2a31e;
    *puVar6 = 0;
  }
  pStr = GetString(this);
  pStrEnd = pStr + this->m_charLength;
  this_00 = ScriptContext::GetCharClassifier
                      ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
  pOVar7 = CharClassifier::SkipWhiteSpace(this_00,pStr,pStrEnd);
  if (pOVar7 < pStrEnd) {
    local_34 = 0;
    bVar3 = 0;
    if (*pOVar7 != L'+') {
      if (*pOVar7 != L'-') goto LAB_00d29e44;
      bVar3 = 1;
    }
    local_34 = bVar3;
    pOVar7 = pOVar7 + 1;
  }
  else {
    local_34 = 0;
  }
LAB_00d29e44:
  if (radix == 0) {
    if (((pStrEnd <= pOVar7) || (radix = 10, *pOVar7 == L'0')) &&
       (radix = 10, 2 < (long)pStrEnd - (long)pOVar7)) {
      if ((OLECHAR)(pOVar7[1] | 0x20U) == 0x78) {
        pOVar7 = pOVar7 + 2;
        radix = 0x10;
      }
      else {
        radix = 10;
      }
    }
  }
  else if (((radix == 0x10) && (radix = 0x10, 2 < (long)pStrEnd - (long)pOVar7)) &&
          ((*pOVar7 == L'0' && ((OLECHAR)(pOVar7[1] | 0x20U) == 0x78)))) {
    pOVar7 = pOVar7 + 2;
  }
  if (0x25 < (uint)radix) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    pStr = (char16 *)__tls_get_addr(&PTR_0155fe48);
    pStr[0] = L'\x01';
    pStr[1] = L'\0';
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xbc2,
                                "(radix <= (sizeof(*__countof_helper(maxUintStringLengthTable)) + 0))"
                                ,"radix <= _countof(maxUintStringLengthTable)");
    if (!bVar4) goto LAB_00d2a31e;
    pStr[0] = L'\0';
    pStr[1] = L'\0';
  }
  if (pStrEnd < pOVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    pStr = (char16 *)__tls_get_addr(&PTR_0155fe48);
    pStr[0] = L'\x01';
    pStr[1] = L'\0';
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xbc3,"(pchEnd >= pch)","pchEnd >= pch");
    if (!bVar4) goto LAB_00d2a31e;
    pStr[0] = L'\0';
    pStr[1] = L'\0';
  }
  if ((ulong)(byte)maxUintStringLengthTable[radix] < (ulong)((long)pStrEnd - (long)pOVar7 >> 1)) {
    BigUInt::BigUInt((BigUInt *)local_f0);
    pOVar13 = pOVar7;
    if (pOVar7 < pStrEnd) {
      do {
        iVar10 = 0xe;
        if (((ulong)(ushort)*pOVar13 < 0x80) &&
           ((int)((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[(ushort)*pOVar13] &
                 0xffffU) < radix)) {
          bVar4 = BigUInt::FMulAdd((BigUInt *)local_f0,radix,
                                   (int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"
                                        [(ushort)*pOVar13] & 0xffffU);
          if (!bVar4) {
            JavascriptError::ThrowOutOfMemoryError
                      ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr);
          }
          iVar5 = BigUInt::Clu((BigUInt *)local_f0);
          iVar10 = 0;
          if (0x20 < iVar5) {
            pStr = (char16 *)
                   (&(((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                         super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                      javascriptLibrary)->super_JavascriptLibraryBase).negativeInfinite)
                   [local_34 ^ 1].ptr;
            iVar10 = 1;
          }
        }
        if (iVar10 != 0) {
          if (iVar10 != 0xe) goto LAB_00d2a1ed;
          break;
        }
        pOVar13 = pOVar13 + 1;
      } while (pOVar13 < pStrEnd);
    }
    if (pOVar7 == pOVar13) {
      pStr = (char16 *)
             (((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
              javascriptLibrary)->super_JavascriptLibraryBase).nan.ptr;
    }
    else {
      dVar15 = BigUInt::GetDbl((BigUInt *)local_f0);
      if (local_34 != 0) {
        dVar15 = -dVar15;
      }
      pStr = (char16 *)
             JavascriptNumber::ToVarIntCheck
                       (dVar15,(((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                               ->super_JavascriptLibraryBase).scriptContext.ptr);
    }
LAB_00d2a1ed:
    BigUInt::~BigUInt((BigUInt *)local_f0);
    return pStr;
  }
  uVar12 = 0;
  pOVar13 = pOVar7;
  if (pOVar7 < pStrEnd) {
    uVar12 = 0;
    bi.m_rgluInit._112_8_ = __tls_get_addr(&PTR_0155fe48);
    do {
      if (((ulong)(ushort)*pOVar13 < 0x80) &&
         ((int)((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[(ushort)*pOVar13] & 0xffffU)
          < radix)) {
        uVar11 = ((int)"%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%"[(ushort)*pOVar13] &
                 0xffffU) + uVar12 * radix;
        bVar4 = true;
        bVar14 = uVar11 < uVar12;
        uVar12 = uVar11;
        if (bVar14) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          uVar2 = bi.m_rgluInit._112_8_;
          *(undefined4 *)bi.m_rgluInit._112_8_ = 1;
          bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                       ,0xbd5,"(value >= beforeValue)","uint overflow");
          if (!bVar14) goto LAB_00d2a31e;
          *(undefined4 *)uVar2 = 0;
        }
      }
      else {
        bVar4 = false;
      }
    } while ((bVar4) && (pOVar13 = pOVar13 + 1, pOVar13 < pStrEnd));
  }
  if (pOVar7 == pOVar13) {
    return (((((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
            javascriptLibrary)->super_JavascriptLibraryBase).nan.ptr;
  }
  if (local_34 == 0) {
    if (-1 < (int)uVar12) goto LAB_00d2a1c8;
    dVar15 = (double)uVar12;
    uVar8 = NumberUtilities::ToSpecial(dVar15);
    bVar4 = NumberUtilities::IsNan(dVar15);
    if (!bVar4) goto LAB_00d2a30c;
    uVar9 = NumberUtilities::ToSpecial(dVar15);
  }
  else {
    if (0 < (int)uVar12) {
      uVar12 = -uVar12;
LAB_00d2a1c8:
      return (Var)((ulong)uVar12 | 0x1000000000000);
    }
    dVar15 = (double)((ulong)(double)uVar12 | 0x8000000000000000);
    uVar8 = NumberUtilities::ToSpecial(dVar15);
    bVar4 = NumberUtilities::IsNan(dVar15);
    if (!bVar4) goto LAB_00d2a30c;
    uVar9 = NumberUtilities::ToSpecial(dVar15);
  }
  if ((uVar9 != 0xfff8000000000000) &&
     (uVar9 = NumberUtilities::ToSpecial(dVar15), uVar9 != 0x7ff8000000000000)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                ,0xa2,
                                "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                ,"We should only produce a NaN with this value");
    if (!bVar4) {
LAB_00d2a31e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
LAB_00d2a30c:
  return (Var)(uVar8 ^ 0xfffc000000000000);
}

Assistant:

Var JavascriptString::ToInteger(int radix)
    {
        AssertMsg(radix == 0 || radix >= 2 && radix <= 36, "'radix' is invalid");
        const char16* pchStart = GetString();
        const char16* pchEnd =  pchStart + m_charLength;
        const char16 *pch = this->GetScriptContext()->GetCharClassifier()->SkipWhiteSpace(pchStart, pchEnd);
        bool isNegative = false;

        if (pch < pchEnd)
        {
            switch (*pch)
            {
            case '-':
                isNegative = true;
                // Fall through.
            case '+':
                pch++;
                break;
            }
        }

        if (0 == radix)
        {
            if (pch < pchEnd && '0' != pch[0])
            {
                radix = 10;
            }
            else if (pchEnd - pch >= 2 && ('x' == pch[1] || 'X' == pch[1]))
            {
                radix = 16;
                pch += 2;
            }
            else
            {
                 // ES5's 'parseInt' does not allow treating a string beginning with a '0' as an octal value. ES3 does not specify a
                 // behavior
                 radix = 10;
            }
        }
        else if (16 == radix)
        {
            if(pchEnd - pch >= 2 && '0' == pch[0] && ('x' == pch[1] || 'X' == pch[1]))
            {
                pch += 2;
            }
        }

        Assert(radix <= _countof(maxUintStringLengthTable));
        Assert(pchEnd >= pch);
        size_t length = pchEnd - pch;
        const char16 *const pchMin = pch;
        __analysis_assume(radix < _countof(maxUintStringLengthTable));
        if(length <= maxUintStringLengthTable[radix])
        {
            // Use uint32 as integer being parsed - much faster than BigInt
            uint32 value = 0;
            for ( ; pch < pchEnd ; pch++)
            {
                char16 ch = *pch;

                if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
                {
                    break;
                }
                uint32 beforeValue = value;
                value = value * radix + ch;
                AssertMsg(value >= beforeValue, "uint overflow");
            }

            if(pchMin == pch)
            {
                return GetScriptContext()->GetLibrary()->GetNaN();
            }

            if(isNegative)
            {
                // negative zero can only be represented by doubles
                if(value <= INT_MAX && value != 0)
                {
                    int32 result = -((int32)value);
                    return JavascriptNumber::ToVar(result, this->GetScriptContext());
                }
                double result = -((double)(value));
                return JavascriptNumber::New(result, this->GetScriptContext());
            }
            return JavascriptNumber::ToVar(value, this->GetScriptContext());
        }

        BigUInt bi;
        for ( ; pch < pchEnd ; pch++)
        {
            char16 ch = *pch;

            if(ch >= _countof(stringToIntegerMap) || (ch = stringToIntegerMap[ch]) >= radix)
            {
                break;
            }
            if (!bi.FMulAdd(radix, ch))
            {
                //Mimic IE8 which threw an OutOfMemory exception in this case.
                JavascriptError::ThrowOutOfMemoryError(GetScriptContext());
            }
            // If we ever have more than 32 ulongs, the result must be infinite.
            if (bi.Clu() > 32)
            {
                Var result = isNegative ?
                    GetScriptContext()->GetLibrary()->GetNegativeInfinite() :
                    GetScriptContext()->GetLibrary()->GetPositiveInfinite();
                return result;
            }
        }

        if (pchMin == pch)
        {
            return GetScriptContext()->GetLibrary()->GetNaN();
        }

        // Convert to a double.
        double result = bi.GetDbl();
        if(isNegative)
        {
            result = -result;
        }

        return Js::JavascriptNumber::ToVarIntCheck(result, GetScriptContext());
    }